

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

CLayer * __thiscall CEditor::GetSelectedLayer(CEditor *this,int Index)

{
  int iVar1;
  int iVar2;
  CLayerGroup *pCVar3;
  CLayerGroup **ppCVar4;
  CLayer **ppCVar5;
  CEditor *in_RDI;
  CLayerGroup *pGroup;
  
  pCVar3 = GetSelectedGroup(in_RDI);
  if ((pCVar3 != (CLayerGroup *)0x0) && (-1 < in_RDI->m_SelectedLayer)) {
    iVar1 = in_RDI->m_SelectedLayer;
    ppCVar4 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                        (&(in_RDI->m_Map).m_lGroups,in_RDI->m_SelectedGroup);
    iVar2 = array<CLayer_*,_allocator_default<CLayer_*>_>::size(&(*ppCVar4)->m_lLayers);
    if (iVar1 < iVar2) {
      ppCVar5 = array<CLayer_*,_allocator_default<CLayer_*>_>::operator[]
                          (&pCVar3->m_lLayers,in_RDI->m_SelectedLayer);
      return *ppCVar5;
    }
  }
  return (CLayer *)0x0;
}

Assistant:

CLayer *CEditor::GetSelectedLayer(int Index)
{
	CLayerGroup *pGroup = GetSelectedGroup();
	if(!pGroup)
		return 0x0;

	if(m_SelectedLayer >= 0 && m_SelectedLayer < m_Map.m_lGroups[m_SelectedGroup]->m_lLayers.size())
		return pGroup->m_lLayers[m_SelectedLayer];
	return 0x0;
}